

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void SstWriterDefinitionLock(SstStream Stream,long EffectiveTimestep)

{
  long lVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  Stream->WriterDefinitionsLocked = 1;
  if ((Stream->Rank == 0) && (0 < Stream->ReaderCount)) {
    lVar1 = 0;
    do {
      UpdateLockDefnsList(Stream,Stream->Readers[lVar1],EffectiveTimestep);
      lVar1 = lVar1 + 1;
    } while (lVar1 < Stream->ReaderCount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  CP_verbose(Stream,PerStepVerbose,"Writer-side definitions lock as of timestep %ld\n",
             EffectiveTimestep);
  return;
}

Assistant:

extern void SstWriterDefinitionLock(SstStream Stream, long EffectiveTimestep)
{
    STREAM_MUTEX_LOCK(Stream);
    Stream->WriterDefinitionsLocked = 1;
    if (Stream->Rank == 0)
    {
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            UpdateLockDefnsList(Stream, Stream->Readers[i], EffectiveTimestep);
        }
    }
    STREAM_MUTEX_UNLOCK(Stream);
    CP_verbose(Stream, PerStepVerbose, "Writer-side definitions lock as of timestep %ld\n",
               EffectiveTimestep);
}